

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

void vli_mmod_fast_secp256r1(uint *result,uint *product)

{
  cmpresult_t cVar1;
  tc_uECC_word_t tVar2;
  tc_uECC_word_t tVar3;
  tc_uECC_word_t tVar4;
  tc_uECC_word_t tVar5;
  tc_uECC_word_t tVar6;
  tc_uECC_word_t tVar7;
  tc_uECC_word_t tVar8;
  tc_uECC_word_t tVar9;
  tc_uECC_word_t tVar10;
  tc_uECC_word_t tVar11;
  int iVar12;
  undefined8 local_78;
  uint tmp [8];
  
  tc_uECC_vli_set(result,product,'\b');
  tmp[0] = 0;
  local_78 = 0;
  tmp[1] = product[0xb];
  tmp[2] = product[0xc];
  tmp[3] = product[0xd];
  tmp[4] = product[0xe];
  tmp[5] = product[0xf];
  tVar2 = tc_uECC_vli_add((tc_uECC_word_t *)&local_78,(tc_uECC_word_t *)&local_78,
                          (tc_uECC_word_t *)&local_78,'\b');
  tVar3 = tc_uECC_vli_add(result,result,(tc_uECC_word_t *)&local_78,'\b');
  tmp[1] = product[0xc];
  tmp[2] = product[0xd];
  tmp[3] = product[0xe];
  tmp[4] = product[0xf];
  tmp[5] = 0;
  tVar4 = tc_uECC_vli_add((tc_uECC_word_t *)&local_78,(tc_uECC_word_t *)&local_78,
                          (tc_uECC_word_t *)&local_78,'\b');
  tVar5 = tc_uECC_vli_add(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 8);
  tmp[0] = product[10];
  tmp[3] = 0;
  tmp[1] = 0;
  tmp[2] = 0;
  tmp[4] = product[0xe];
  tmp[5] = product[0xf];
  tVar6 = tc_uECC_vli_add(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 9);
  tmp[0] = product[0xb];
  tmp[1] = product[0xd];
  tmp[2] = product[0xe];
  tmp[3] = product[0xf];
  tmp[5] = product[8];
  tmp[4] = tmp[1];
  tVar7 = tc_uECC_vli_add(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 0xb);
  tmp[0] = product[0xd];
  tmp[3] = 0;
  tmp[1] = 0;
  tmp[2] = 0;
  tmp[4] = product[8];
  tmp[5] = product[10];
  tVar8 = tc_uECC_vli_sub(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 0xc);
  tmp[0] = product[0xe];
  tmp[1] = product[0xf];
  tmp[2] = 0;
  tmp[3] = 0;
  tmp[4] = product[9];
  tmp[5] = product[0xb];
  tVar9 = tc_uECC_vli_sub(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 0xd);
  tmp[0] = product[0xf];
  tmp[1] = product[8];
  tmp[2] = product[9];
  tmp[3] = product[10];
  tmp[4] = 0;
  tmp[5] = product[0xc];
  tVar10 = tc_uECC_vli_sub(result,result,(tc_uECC_word_t *)&local_78,'\b');
  local_78 = *(undefined8 *)(product + 0xe);
  tmp[0] = 0;
  tmp[1] = product[9];
  tmp[2] = product[10];
  tmp[3] = product[0xb];
  tmp[4] = 0;
  tmp[5] = product[0xd];
  tVar11 = tc_uECC_vli_sub(result,result,(tc_uECC_word_t *)&local_78,'\b');
  iVar12 = (tVar7 + tVar6 + tVar5 + tVar4 + tVar3 + tVar2) - (tVar11 + tVar10 + tVar9 + tVar8);
  if (iVar12 < 0) {
    do {
      tVar2 = tc_uECC_vli_add(result,result,curve_secp256r1.p,'\b');
      iVar12 = iVar12 + tVar2;
    } while (iVar12 < 0);
    return;
  }
  while ((iVar12 != 0 ||
         (cVar1 = tc_uECC_vli_cmp_unsafe(curve_secp256r1.p,result,'\b'), cVar1 != '\x01'))) {
    tVar2 = tc_uECC_vli_sub(result,result,curve_secp256r1.p,'\b');
    iVar12 = iVar12 - tVar2;
  }
  return;
}

Assistant:

void vli_mmod_fast_secp256r1(unsigned int *result, unsigned int*product)
{
	unsigned int tmp[NUM_ECC_WORDS];
	int carry;

	/* t */
	tc_uECC_vli_set(result, product, NUM_ECC_WORDS);

	/* s1 */
	tmp[0] = tmp[1] = tmp[2] = 0;
	tmp[3] = product[11];
	tmp[4] = product[12];
	tmp[5] = product[13];
	tmp[6] = product[14];
	tmp[7] = product[15];
	carry = tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s2 */
	tmp[3] = product[12];
	tmp[4] = product[13];
	tmp[5] = product[14];
	tmp[6] = product[15];
	tmp[7] = 0;
	carry += tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s3 */
	tmp[0] = product[8];
	tmp[1] = product[9];
	tmp[2] = product[10];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[14];
	tmp[7] = product[15];
  	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s4 */
	tmp[0] = product[9];
	tmp[1] = product[10];
	tmp[2] = product[11];
	tmp[3] = product[13];
	tmp[4] = product[14];
	tmp[5] = product[15];
	tmp[6] = product[13];
	tmp[7] = product[8];
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* d1 */
	tmp[0] = product[11];
	tmp[1] = product[12];
	tmp[2] = product[13];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[8];
	tmp[7] = product[10];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d2 */
	tmp[0] = product[12];
	tmp[1] = product[13];
	tmp[2] = product[14];
	tmp[3] = product[15];
	tmp[4] = tmp[5] = 0;
	tmp[6] = product[9];
	tmp[7] = product[11];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d3 */
	tmp[0] = product[13];
	tmp[1] = product[14];
	tmp[2] = product[15];
	tmp[3] = product[8];
	tmp[4] = product[9];
	tmp[5] = product[10];
	tmp[6] = 0;
	tmp[7] = product[12];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d4 */
	tmp[0] = product[14];
	tmp[1] = product[15];
	tmp[2] = 0;
	tmp[3] = product[9];
	tmp[4] = product[10];
	tmp[5] = product[11];
	tmp[6] = 0;
	tmp[7] = product[13];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	if (carry < 0) {
		do {
			carry += tc_uECC_vli_add(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
		while (carry < 0);
	} else  {
		while (carry ||
		       tc_uECC_vli_cmp_unsafe(curve_secp256r1.p, result, NUM_ECC_WORDS) != 1) {
			carry -= tc_uECC_vli_sub(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
	}
}